

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBucket::~LargeHeapBucket(LargeHeapBucket *this)

{
  Recycler *pRVar1;
  LargeHeapBlock *list;
  HeapInfo *in_RCX;
  anon_class_16_2_41051075 fn;
  anon_class_16_2_41051075 fn_00;
  anon_class_16_2_41051075 fn_01;
  anon_class_16_2_41051075 fn_02;
  anon_class_16_2_41051075 fn_03;
  anon_class_16_2_41051075 fn_04;
  
  pRVar1 = (Recycler *)(this->super_HeapBucket).heapInfo;
  list = *(LargeHeapBlock **)pRVar1;
  fn.autoHeap = in_RCX;
  fn.recycler = pRVar1;
  HeapBlockList::
  ForEachEditing<Memory::LargeHeapBlock,Memory::LargeHeapBucket::~LargeHeapBucket()::__0>
            ((HeapBlockList *)this->fullLargeBlockList,list,fn);
  fn_00.autoHeap = in_RCX;
  fn_00.recycler = pRVar1;
  HeapBlockList::
  ForEachEditing<Memory::LargeHeapBlock,Memory::LargeHeapBucket::~LargeHeapBucket()::__0>
            ((HeapBlockList *)this->largeBlockList,list,fn_00);
  fn_01.autoHeap = in_RCX;
  fn_01.recycler = pRVar1;
  HeapBlockList::
  ForEachEditing<Memory::LargeHeapBlock,Memory::LargeHeapBucket::~LargeHeapBucket()::__0>
            ((HeapBlockList *)this->largePageHeapBlockList,list,fn_01);
  fn_02.autoHeap = in_RCX;
  fn_02.recycler = pRVar1;
  HeapBlockList::
  ForEachEditing<Memory::LargeHeapBlock,Memory::LargeHeapBucket::~LargeHeapBucket()::__0>
            ((HeapBlockList *)this->pendingDisposeLargeBlockList,list,fn_02);
  fn_03.autoHeap = in_RCX;
  fn_03.recycler = pRVar1;
  HeapBlockList::
  ForEachEditing<Memory::LargeHeapBlock,Memory::LargeHeapBucket::~LargeHeapBucket()::__0>
            ((HeapBlockList *)this->pendingSweepLargeBlockList,list,fn_03);
  fn_04.autoHeap = in_RCX;
  fn_04.recycler = pRVar1;
  HeapBlockList::
  ForEachEditing<Memory::LargeHeapBlock,Memory::LargeHeapBucket::~LargeHeapBucket()::__0>
            ((HeapBlockList *)this->partialSweptLargeBlockList,list,fn_04);
  return;
}

Assistant:

LargeHeapBucket::~LargeHeapBucket()
{
    Recycler* recycler = this->heapInfo->recycler;
    HeapInfo* autoHeap = this->heapInfo;

    ForEachEditingLargeHeapBlock([recycler, autoHeap](LargeHeapBlock * heapBlock)
    {
        heapBlock->ReleasePagesShutdown(recycler);
        LargeHeapBlock::Delete(heapBlock);
        RECYCLER_SLOW_CHECK(autoHeap->heapBlockCount[HeapBlock::HeapBlockType::LargeBlockType]--);
    });
}